

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd-socket.c
# Opt level: O3

void setup_fd_socket(Socket *s,int infd,int outfd,int inerrfd)

{
  Socket *e;
  
  if (s->vt != &FdSocket_sockvt) {
    __assert_fail("fds->sock.vt == &FdSocket_sockvt",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/fd-socket.c"
                  ,0x153,"void setup_fd_socket(Socket *, int, int, int)");
  }
  if (s[-0x410].vt != (SocketVtable *)0x0) {
    (**(code **)(s[-0x410].vt)->plug)();
    s[-0x410].vt = (SocketVtable *)0x0;
  }
  e = s + -0x412;
  *(int *)((long)&s[-0x412].vt + 4) = infd;
  *(int *)&s[-0x412].vt = outfd;
  *(int *)&s[-0x411].vt = inerrfd;
  if (-1 < outfd) {
    if (fdsocket_by_outfd == (tree234 *)0x0) {
      fdsocket_by_outfd = newtree234(fdsocket_outfd_cmp);
    }
    add234(fdsocket_by_outfd,e);
    infd = *(int *)((long)&s[-0x412].vt + 4);
  }
  if (-1 < infd) {
    if (fdsocket_by_infd == (tree234 *)0x0) {
      fdsocket_by_infd = newtree234(fdsocket_infd_cmp);
    }
    add234(fdsocket_by_infd,e);
    uxsel_set(*(int *)((long)&s[-0x412].vt + 4),1,fdsocket_select_result_input);
  }
  if (-1 < *(int *)&s[-0x411].vt) {
    if (*(int *)&s[-0x411].vt == *(int *)((long)&s[-0x412].vt + 4)) {
      __assert_fail("fds->inerrfd != fds->infd",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/fd-socket.c"
                    ,0x16c,"void setup_fd_socket(Socket *, int, int, int)");
    }
    if (fdsocket_by_inerrfd == (tree234 *)0x0) {
      fdsocket_by_inerrfd = newtree234(fdsocket_inerrfd_cmp);
    }
    add234(fdsocket_by_inerrfd,e);
    uxsel_set(*(int *)&s[-0x411].vt,1,fdsocket_select_result_input_error);
  }
  queue_toplevel_callback(fdsocket_connect_success_callback,e);
  return;
}

Assistant:

void setup_fd_socket(Socket *s, int infd, int outfd, int inerrfd)
{
    FdSocket *fds = container_of(s, FdSocket, sock);
    assert(fds->sock.vt == &FdSocket_sockvt);

    if (fds->opener) {
        deferred_socket_opener_free(fds->opener);
        fds->opener = NULL;
    }

    fds->infd = infd;
    fds->outfd = outfd;
    fds->inerrfd = inerrfd;

    if (fds->outfd >= 0) {
        if (!fdsocket_by_outfd)
            fdsocket_by_outfd = newtree234(fdsocket_outfd_cmp);
        add234(fdsocket_by_outfd, fds);
    }

    if (fds->infd >= 0) {
        if (!fdsocket_by_infd)
            fdsocket_by_infd = newtree234(fdsocket_infd_cmp);
        add234(fdsocket_by_infd, fds);
        uxsel_set(fds->infd, SELECT_R, fdsocket_select_result_input);
    }

    if (fds->inerrfd >= 0) {
        assert(fds->inerrfd != fds->infd);
        if (!fdsocket_by_inerrfd)
            fdsocket_by_inerrfd = newtree234(fdsocket_inerrfd_cmp);
        add234(fdsocket_by_inerrfd, fds);
        uxsel_set(fds->inerrfd, SELECT_R, fdsocket_select_result_input_error);
    }

    queue_toplevel_callback(fdsocket_connect_success_callback, fds);
}